

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::GPUShaderFP64Test4::GPUShaderFP64Test4(GPUShaderFP64Test4 *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"state_query",
             "Verifies glGet*() calls, as well as \"program interface query\"-specific tools report correct properties of & values assigned to double-precision uniforms."
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01dccb38;
  this->m_has_test_passed = true;
  this->m_uniform_name_buffer = (char *)0x0;
  this->m_cs_id = 0;
  this->m_fs_id = 0;
  this->m_gs_id = 0;
  this->m_po_cs_id = 0;
  this->m_po_noncs_id = 0;
  this->m_tc_id = 0;
  this->m_te_id = 0;
  this->m_vs_id = 0;
  _stage_data::_stage_data(&this->m_data_cs);
  _stage_data::_stage_data(&this->m_data_fs);
  _stage_data::_stage_data(&this->m_data_gs);
  _stage_data::_stage_data(&this->m_data_tc);
  _stage_data::_stage_data(&this->m_data_te);
  _stage_data::_stage_data(&this->m_data_vs);
  return;
}

Assistant:

GPUShaderFP64Test4::GPUShaderFP64Test4(deqp::Context& context)
	: TestCase(context, "state_query", "Verifies glGet*() calls, as well as \"program interface query\"-specific tools"
									   " report correct properties of & values assigned to double-precision uniforms.")
	, m_has_test_passed(true)
	, m_uniform_name_buffer(0)
	, m_cs_id(0)
	, m_fs_id(0)
	, m_gs_id(0)
	, m_po_cs_id(0)
	, m_po_noncs_id(0)
	, m_tc_id(0)
	, m_te_id(0)
	, m_vs_id(0)
{
	/* Left blank intentionally */
}